

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BCRec.cpp
# Opt level: O2

ostream * amrex::operator<<(ostream *os,BCRec *b)

{
  ostream *poVar1;
  long lVar2;
  
  std::operator<<(os,"(BCREC ");
  for (lVar2 = -0xc; lVar2 != 0; lVar2 = lVar2 + 4) {
    poVar1 = (ostream *)std::ostream::operator<<(os,*(int *)((long)b->bc + lVar2 + 0xc));
    poVar1 = std::operator<<(poVar1,':');
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)b[1].bc + lVar2));
    std::operator<<(poVar1,' ');
  }
  std::operator<<(os,')');
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream& os,
            const BCRec&  b)
{
    os << "(BCREC ";
    for (int i = 0; i < AMREX_SPACEDIM; i++)
    {
        os << b.bc[i] << ':' << b.bc[i+AMREX_SPACEDIM] << ' ';
    }
    os << ')';
    return os;
}